

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int BrotliEncoderCompress
              (int quality,int lgwin,BrotliEncoderMode mode,size_t input_size,uint8_t *input_buffer,
              size_t *encoded_size,uint8_t *encoded_buffer)

{
  uint8_t *puVar1;
  byte prev_byte;
  ulong uVar2;
  uint32_t num_distance_codes;
  int iVar3;
  Command_conflict *p;
  ContextType literal_context_mode;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  BrotliEncoderState *s;
  ulong uVar8;
  int *piVar9;
  uint16_t *puVar10;
  uint8_t *puVar11;
  ZopfliNode *array;
  ulong uVar12;
  uint8_t *puVar13;
  ulong uVar14;
  ulong uVar15;
  Command_conflict *pCVar16;
  char cVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  uint16_t *puVar21;
  uint16_t *puVar22;
  ulong uVar23;
  uint16_t *puVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  BrotliEncoderParams *pBVar28;
  uint8_t *puVar29;
  uint8_t **ppuVar30;
  ulong uVar31;
  long lVar32;
  uint8_t prev_byte_00;
  ulong uVar33;
  long lVar34;
  ulong num_bytes;
  size_t sVar35;
  uint16_t *puVar36;
  size_t out_size;
  ulong uVar37;
  uint8_t *puVar38;
  ulong uVar39;
  size_t __n;
  bool bVar40;
  byte bVar41;
  uint8_t last_bytes_bits;
  int *local_380;
  uint16_t last_bytes;
  ulong local_370;
  uint16_t *local_368;
  uint8_t *local_360;
  ulong *local_358;
  ulong local_350;
  Command_conflict *local_348;
  size_t local_340;
  ulong local_338;
  uint16_t *local_330;
  uint16_t *local_328;
  ulong local_320;
  ulong local_318;
  size_t num_literals;
  int dist_cache [4];
  ulong local_2f0;
  uint8_t *local_2e8;
  MemoryManager memory_manager;
  ulong local_2a8;
  uint8_t *local_2a0;
  uint local_278;
  size_t last_insert_len;
  uint8_t *next_in;
  uint local_260;
  uint local_25c;
  ulong local_258;
  int local_24c;
  uint local_248;
  uint uStack_244;
  int iStack_240;
  int iStack_23c;
  uint local_238;
  int saved_dist_cache [4];
  size_t available_in;
  BlockSplit local_160;
  BlockSplit local_130;
  uint32_t *local_100;
  size_t sStack_f8;
  uint32_t *local_f0;
  size_t sStack_e8;
  HistogramLiteral *local_e0;
  size_t sStack_d8;
  HistogramCommand *local_d0;
  size_t sStack_c8;
  HistogramDistance *local_c0;
  size_t sStack_b8;
  size_t available_out;
  uint local_70;
  
  bVar41 = 0;
  uVar31 = *encoded_size;
  local_360 = input_buffer;
  local_358 = encoded_size;
  sVar6 = BrotliEncoderMaxCompressedSize(input_size);
  if (uVar31 == 0) {
    return 0;
  }
  if (input_size == 0) {
    *local_358 = 1;
    *encoded_buffer = '\x06';
    return 1;
  }
  local_370 = input_size;
  if (quality != 10) {
    s = BrotliEncoderCreateInstance((brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
    if (s == (BrotliEncoderState *)0x0) {
      return 0;
    }
    available_in = local_370;
    next_in = local_360;
    available_out = *local_358;
    dist_cache[0] = 0;
    dist_cache[1] = 0;
    memory_manager.alloc_func = (brotli_alloc_func)encoded_buffer;
    if (s->is_initialized_ == 0) {
      (s->params).quality = quality;
      (s->params).lgwin = lgwin;
      (s->params).mode = mode;
      (s->params).size_hint = local_370 & 0xffffffff;
      if (0x18 < lgwin) {
        (s->params).large_window = 1;
      }
    }
    iVar4 = BrotliEncoderCompressStream
                      (s,BROTLI_OPERATION_FINISH,&available_in,&next_in,&available_out,
                       (uint8_t **)&memory_manager,(size_t *)dist_cache);
    if ((s->stream_state_ != BROTLI_STREAM_FINISHED) || (s->available_out_ != 0)) {
      iVar4 = 0;
    }
    *local_358 = dist_cache._0_8_;
    BrotliEncoderDestroyInstance(s);
    if ((iVar4 != 0) && ((sVar6 == 0 || (*local_358 <= sVar6)))) {
      return 1;
    }
    goto LAB_00104fcb;
  }
  uVar5 = 0x10;
  if (0x10 < lgwin) {
    uVar5 = lgwin;
  }
  uVar19 = 0x1e;
  if ((int)uVar5 < 0x1e) {
    uVar19 = uVar5;
  }
  puVar21 = (uint16_t *)(1L << ((byte)uVar19 & 0x3f));
  dist_cache[0] = 4;
  dist_cache[1] = 0xb;
  dist_cache[2] = 0xf;
  dist_cache[3] = 0x10;
  saved_dist_cache[0] = 4;
  saved_dist_cache[1] = 0xb;
  saved_dist_cache[2] = 0xf;
  saved_dist_cache[3] = 0x10;
  local_368 = puVar21;
  if (input_size < puVar21) {
    local_368 = (uint16_t *)input_size;
  }
  cVar17 = '\x17';
  if ((int)uVar5 < 0x17) {
    cVar17 = (char)uVar5;
  }
  uVar7 = 1L << (cVar17 + 1U & 0x3f);
  BrotliEncoderInitParams((BrotliEncoderParams *)&next_in);
  puVar38 = local_360;
  uVar5 = uVar19;
  local_260 = uVar19;
  if (lgwin < 0x19) {
    uVar18 = 0x1e;
    if (local_24c == 0) {
      uVar18 = 0x18;
    }
    if (uVar18 < uVar19) {
      uVar5 = 0x18;
      local_260 = uVar18;
    }
  }
  else {
    local_24c = 1;
  }
  next_in = (uint8_t *)CONCAT44(10,next_in._0_4_);
  if (local_25c == 0) {
    uVar18 = 0x10;
    if ((0x10 < uVar5) && (uVar18 = 0x12, uVar5 < 0x12)) {
      uVar18 = uVar5;
    }
  }
  else {
    if ((int)local_25c < 0x11) {
      local_25c = 0x10;
    }
    uVar18 = 0x18;
    if ((int)local_25c < 0x18) {
      uVar18 = local_25c;
    }
  }
  local_25c = uVar18;
  ChooseDistanceParams((BrotliEncoderParams *)&next_in);
  uVar8 = 1L << ((byte)local_25c & 0x3f);
  BrotliInitMemoryManager(&memory_manager,(brotli_alloc_func)0x0,(brotli_free_func)0x0,(void *)0x0);
  EncodeWindowBits(uVar19,local_24c,&last_bytes,&last_bytes_bits);
  puVar10 = local_368;
  uVar27 = local_370;
  if (9 < (int)next_in._4_4_) {
    local_248 = 10;
    puVar22 = (uint16_t *)(1L << ((byte)local_260 & 0x3f));
    if (local_368 <= puVar22) {
      puVar22 = local_368;
    }
    pBVar28 = (BrotliEncoderParams *)((long)puVar22 * 8 + 0x80038);
    goto LAB_0010422f;
  }
  local_248 = next_in._4_4_;
  if (next_in._4_4_ == 4) {
    if (0xfffff < local_258) {
      local_248 = 0x36;
      pBVar28 = (BrotliEncoderParams *)0x400038;
      goto LAB_0010422f;
    }
  }
  else if (4 < (int)next_in._4_4_) {
    if ((int)local_260 < 0x11) {
      local_248 = 0x28;
      if (6 < next_in._4_4_) {
        local_248 = 0x2a - (next_in._4_4_ < 9);
      }
    }
    else {
      if ((local_260 < 0x13) || (local_258 < 0x100000)) {
        uStack_244 = next_in._4_4_ < 7 ^ 0xf;
        local_248 = 5;
      }
      else {
        iStack_23c = 5;
        uStack_244 = 0xf;
        local_248 = 6;
      }
      uVar5 = 0x10;
      if (next_in._4_4_ < 9) {
        uVar5 = 10;
      }
      local_238 = 4;
      if (6 < next_in._4_4_) {
        local_238 = uVar5;
      }
      iStack_240 = next_in._4_4_ - 1;
    }
  }
  switch(local_248) {
  case 2:
    pBVar28 = (BrotliEncoderParams *)0x4002c;
    break;
  case 3:
    pBVar28 = (BrotliEncoderParams *)0x40030;
    break;
  case 4:
switchD_00104348_caseD_4:
    pBVar28 = (BrotliEncoderParams *)0x80038;
    break;
  case 5:
    lVar34 = 0x40;
    goto LAB_0010512f;
  case 6:
    lVar34 = 0x50;
LAB_0010512f:
    pBVar28 = (BrotliEncoderParams *)
              (((4L << ((byte)iStack_240 & 0x3f) | 2U) << ((byte)uStack_244 & 0x3f)) + lVar34);
    if (pBVar28 != (BrotliEncoderParams *)0x0) break;
    piVar9 = (int *)0x0;
    goto LAB_0010423f;
  default:
    if ((local_248 == 0x28) || (local_248 == 0x29)) goto switchD_00104348_caseD_4;
    if (local_248 == 0x2a) {
      pBVar28 = (BrotliEncoderParams *)(kStaticDictionaryBuckets + 0x4370);
    }
    else {
      pBVar28 = (BrotliEncoderParams *)0x28;
    }
  }
LAB_0010422f:
  piVar9 = (int *)BrotliAllocate(&memory_manager,(size_t)pBVar28);
LAB_0010423f:
  *(ulong *)piVar9 = CONCAT44(uStack_244,local_248);
  *(ulong *)(piVar9 + 2) = CONCAT44(iStack_23c,iStack_240);
  piVar9[4] = local_238;
  iVar4 = *piVar9;
  cVar17 = (char)((ulong)next_in >> 0x20);
  local_380 = piVar9;
  if (iVar4 == 0x2a) {
    *(ulong *)(piVar9 + 0x5010a) = (ulong)(((int)next_in._4_4_ < 7) + 7 << (cVar17 - 4U & 0x1f));
LAB_001043df:
    iVar4 = *piVar9;
  }
  else {
    if (iVar4 == 6) {
      InitializeH6((HasherHandle)piVar9,pBVar28);
      goto LAB_001043df;
    }
    if (iVar4 == 10) {
      uVar5 = -1 << ((byte)local_260 & 0x1f);
      *(ulong *)(piVar9 + 10) = (ulong)~uVar5;
      piVar9[0x2000c] = uVar5 + 1;
      goto LAB_001043df;
    }
    if ((iVar4 == 0x28) || (iVar4 == 0x29)) {
      *(ulong *)(piVar9 + 0x2000c) = (ulong)(((int)next_in._4_4_ < 7) + 7 << (cVar17 - 4U & 0x1f));
      goto LAB_001043df;
    }
    if (iVar4 == 5) {
      InitializeH5((HasherHandle)piVar9,pBVar28);
      goto LAB_001043df;
    }
  }
  piVar9[5] = 0;
  switch(iVar4) {
  case 2:
    PrepareH2((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    break;
  case 3:
    PrepareH3((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    break;
  case 4:
    PrepareH4((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    break;
  case 5:
    PrepareH5((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    break;
  case 6:
    PrepareH6((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    break;
  case 7:
  case 8:
  case 9:
    break;
  case 10:
    iVar4 = local_380[0x2000c];
    for (lVar34 = 0; lVar34 != 0x20000; lVar34 = lVar34 + 1) {
      local_380[lVar34 + 0xc] = iVar4;
    }
    break;
  default:
    if (iVar4 == 0x28) {
      PrepareH40((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    }
    else if (iVar4 == 0x29) {
      PrepareH41((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    }
    else if (iVar4 == 0x2a) {
      PrepareH42((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    }
    else if (iVar4 == 0x36) {
      PrepareH54((HasherHandle)local_380,1,(size_t)puVar10,puVar38);
    }
  }
  puVar10 = (uint16_t *)(uVar7 >> 3);
  local_380[6] = 0;
  local_380[7] = 0;
  local_380[8] = 0;
  local_380[9] = 0;
  local_380[5] = 1;
  bVar40 = true;
  local_2a8 = 0;
  prev_byte = 0;
  local_2f0 = 0;
  local_2a0 = encoded_buffer;
  uVar39 = 0;
  while ((bVar40 && (uVar39 < uVar27))) {
    uVar25 = uVar39 + uVar7;
    if (uVar27 < uVar25) {
      uVar25 = uVar27;
    }
    last_insert_len = 0;
    puVar11 = (uint8_t *)((uVar25 - uVar39) / 0xc + 0x10);
    num_literals = 0;
    literal_context_mode =
         ChooseContextMode((BrotliEncoderParams *)&next_in,puVar38,uVar39,0x7fffffffffffffff,
                           uVar25 - uVar39);
    local_340 = 0;
    local_2e8 = (uint8_t *)0x0;
    local_328 = (uint16_t *)0x0;
    local_348 = (Command_conflict *)0x0;
    uVar27 = uVar39;
    do {
      num_bytes = uVar25 - uVar27;
      puVar22 = local_328;
      if (uVar25 < uVar27 || num_bytes == 0) break;
      if (uVar8 <= num_bytes) {
        num_bytes = uVar8;
      }
      sVar35 = num_bytes + 1;
      if (sVar35 == 0) {
        array = (ZopfliNode *)0x0;
      }
      else {
        array = (ZopfliNode *)BrotliAllocate(&memory_manager,sVar35 * 0x10);
      }
      piVar9 = local_380;
      BrotliInitZopfliNodes(array,sVar35);
      if ((0x7f < uVar27) && (2 < num_bytes)) {
        uVar33 = uVar27 - 0x7f;
        uVar12 = (num_bytes + uVar27) - 0x7f;
        if (uVar27 < uVar12) {
          uVar12 = uVar27;
        }
        for (; uVar33 < uVar12; uVar33 = uVar33 + 1) {
          uVar2 = *(ulong *)(piVar9 + 10);
          uVar26 = uVar27 - uVar33;
          if (uVar27 - uVar33 < 0x10) {
            uVar26 = 0xf;
          }
          puVar13 = puVar38 + (uVar33 & 0x7fffffffffffffff);
          uVar14 = (ulong)((uint)(*(int *)(puVar38 + (uVar33 & 0x7fffffffffffffff)) * 0x1e35a7bd) >>
                          0xf);
          uVar5 = piVar9[uVar14 + 0xc];
          local_320 = (uVar2 & uVar33) * 2 + 1;
          local_338 = (uVar2 & uVar33) * 2;
          piVar9[uVar14 + 0xc] = (int)uVar33;
          puVar29 = puVar38 + (uVar33 & 0x7fffffffffffffff);
          lVar34 = 0x40;
          puVar22 = (uint16_t *)0x0;
          puVar24 = (uint16_t *)0x0;
          while( true ) {
            puVar36 = puVar24;
            uVar14 = (ulong)uVar5;
            if (uVar33 == uVar14) break;
            bVar40 = lVar34 == 0;
            lVar34 = lVar34 + -1;
            if ((uVar2 - uVar26 < uVar33 - uVar14) || (bVar40)) break;
            puVar24 = puVar36;
            if (puVar22 < puVar36) {
              puVar24 = puVar22;
            }
            puVar1 = puVar38 + uVar14;
            uVar23 = 0x80 - (long)puVar24;
            uVar37 = uVar23 & 0xfffffffffffffff8;
            uVar14 = 0;
            lVar32 = 0;
LAB_001047cf:
            if (uVar23 >> 3 == uVar14) {
              uVar15 = (ulong)((uint)uVar23 & 7);
              for (; (bVar40 = uVar15 != 0, uVar15 = uVar15 - 1, uVar14 = uVar23, bVar40 &&
                     (uVar14 = uVar37,
                     (puVar29 + (long)puVar24)[uVar37] == (puVar1 + (long)puVar24)[uVar37]));
                  uVar37 = uVar37 + 1) {
              }
            }
            else {
              uVar15 = *(ulong *)(puVar1 + (long)puVar24 + uVar14 * 8);
              uVar20 = *(ulong *)(puVar29 + (long)puVar24 + uVar14 * 8);
              if (uVar15 == uVar20) goto code_r0x001047e8;
              uVar20 = uVar20 ^ uVar15;
              uVar14 = 0;
              if (uVar20 != 0) {
                for (; (uVar20 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
                }
              }
              uVar14 = (uVar14 >> 3 & 0x1fffffff) - lVar32;
            }
            puVar24 = (uint16_t *)(uVar14 + (long)puVar24);
            local_278 = (uint)uVar2;
            piVar9 = local_380;
            puVar38 = local_360;
            local_368 = puVar22;
            local_330 = puVar36;
            if ((uint16_t *)0x7f < puVar24) {
              local_380[local_338 + 0x2000e] = local_380[(ulong)(local_278 & uVar5) * 2 + 0x2000e];
              iVar4 = local_380[(ulong)(local_278 & uVar5) * 2 + 0x2000f];
              goto LAB_001048ea;
            }
            uVar14 = (ulong)(uVar5 & local_278) * 2;
            if (puVar1[(long)puVar24] < puVar13[(long)puVar24]) {
              local_380[local_338 + 0x2000e] = uVar5;
              uVar14 = uVar14 | 1;
              puVar22 = puVar24;
              puVar24 = puVar36;
              local_338 = uVar14;
            }
            else {
              local_380[local_320 + 0x2000e] = uVar5;
              local_320 = uVar14;
            }
            uVar5 = local_380[uVar14 + 0x2000e];
          }
          iVar4 = piVar9[0x2000c];
          piVar9[local_338 + 0x2000e] = iVar4;
LAB_001048ea:
          piVar9[local_320 + 0x2000e] = iVar4;
        }
      }
      local_318 = uVar27;
      sVar35 = BrotliZopfliComputeShortestPath
                         (&memory_manager,num_bytes,uVar27,puVar38,0x7fffffffffffffff,
                          (BrotliEncoderParams *)&next_in,(size_t)(puVar21 + -8),dist_cache,
                          (HasherHandle)piVar9,array);
      puVar13 = (uint8_t *)((long)local_328 + sVar35 + 1);
      if (puVar13 < puVar11) {
        puVar13 = puVar11;
      }
      pCVar16 = local_348;
      if ((local_2e8 != puVar13) &&
         (pCVar16 = (Command_conflict *)BrotliAllocate(&memory_manager,(long)puVar13 << 4),
         p = local_348, uVar27 = local_318, local_2e8 = puVar13,
         local_348 != (Command_conflict *)0x0)) {
        memcpy(pCVar16,local_348,(long)local_328 << 4);
        BrotliFree(&memory_manager,p);
        uVar27 = local_318;
      }
      local_368 = (uint16_t *)(sVar35 + (long)local_328);
      local_348 = pCVar16;
      BrotliZopfliCreateCommands
                (num_bytes,uVar27,(size_t)(puVar21 + -8),array,dist_cache,&last_insert_len,
                 (BrotliEncoderParams *)&next_in,pCVar16 + (long)local_328,&num_literals);
      puVar22 = local_368;
      local_340 = local_340 + num_bytes;
      BrotliFree(&memory_manager,array);
      if (puVar10 < puVar22) break;
      uVar27 = uVar27 + num_bytes;
      local_328 = puVar22;
    } while (num_literals <= puVar10);
    sVar35 = local_340;
    puVar38 = local_360;
    if (last_insert_len != 0) {
      local_348[(long)puVar22].insert_len_ = (uint32_t)last_insert_len;
      local_348[(long)puVar22].copy_len_ = 0x8000000;
      local_348[(long)puVar22].dist_extra_ = 0;
      local_348[(long)puVar22].dist_prefix_ = 0x10;
      if (last_insert_len < 6) {
        uVar27 = last_insert_len & 0xffffffff;
      }
      else if (last_insert_len < 0x82) {
        uVar5 = 0x1f;
        uVar19 = (uint)(last_insert_len - 2);
        if (uVar19 != 0) {
          for (; uVar19 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar27 = (ulong)((int)(last_insert_len - 2 >> ((char)(uVar5 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                         (uVar5 ^ 0xffffffe0) * 2 + 0x40);
      }
      else if (last_insert_len < 0x842) {
        uVar19 = (uint32_t)last_insert_len - 0x42;
        uVar5 = 0x1f;
        if (uVar19 != 0) {
          for (; uVar19 >> uVar5 == 0; uVar5 = uVar5 - 1) {
          }
        }
        uVar27 = (ulong)((uVar5 ^ 0xffe0) + 0x2a);
      }
      else {
        uVar27 = 0x15;
        if (0x1841 < last_insert_len) {
          uVar27 = (ulong)(ushort)(0x17 - (last_insert_len < 0x5842));
        }
      }
      iVar4 = (int)((uVar27 & 0xffff) >> 3) * 3;
      local_348[(long)puVar22].cmd_prefix_ =
           ((ushort)(0x520d40 >> ((char)iVar4 * '\x02' & 0x1fU)) & 0xc0) + (short)iVar4 * 0x40 +
           ((ushort)uVar27 & 7) * 8 + 0x42;
      num_literals = num_literals + last_insert_len;
      puVar22 = (uint16_t *)((long)puVar22 + 1);
    }
    uVar25 = local_340 + uVar39;
    local_350 = (ulong)last_bytes_bits;
    if (local_340 == 0) {
      puVar22 = (uint16_t *)BrotliAllocate(&memory_manager,0x10);
      *puVar22 = last_bytes;
      *(ulong *)((long)puVar22 + (local_350 >> 3)) =
           3L << ((byte)local_350 & 7) | (ulong)*(byte *)((long)puVar22 + (local_350 >> 3));
      local_350 = (ulong)((int)local_350 + 9U & 0xfffffff8);
    }
    else {
      local_368 = (uint16_t *)(ulong)(uVar25 == local_370);
      iVar4 = ShouldCompress(local_360,0x7fffffffffffffff,uVar39,local_340,num_literals,
                             (size_t)puVar22);
      if (iVar4 == 0) {
        dist_cache[0] = saved_dist_cache[0];
        dist_cache[1] = saved_dist_cache[1];
        dist_cache[2] = saved_dist_cache[2];
        dist_cache[3] = saved_dist_cache[3];
        puVar22 = (uint16_t *)BrotliAllocate(&memory_manager,sVar35 + 0x10);
        *puVar22 = last_bytes;
        BrotliStoreUncompressedMetaBlock
                  ((int)local_368,puVar38,uVar39,0x7fffffffffffffff,sVar35,&local_350,
                   (uint8_t *)puVar22);
      }
      else {
        ppuVar30 = &next_in;
        pBVar28 = (BrotliEncoderParams *)&available_out;
        for (lVar34 = 0x10; lVar34 != 0; lVar34 = lVar34 + -1) {
          *(uint8_t **)pBVar28 = *ppuVar30;
          ppuVar30 = ppuVar30 + (ulong)bVar41 * -2 + 1;
          pBVar28 = (BrotliEncoderParams *)((long)pBVar28 + (ulong)bVar41 * -0x10 + 8);
        }
        local_320 = uVar25;
        BrotliInitBlockSplit((BlockSplit *)&available_in);
        BrotliInitBlockSplit(&local_160);
        BrotliInitBlockSplit(&local_130);
        pCVar16 = local_348;
        local_c0 = (HistogramDistance *)0x0;
        sStack_b8 = 0;
        local_d0 = (HistogramCommand *)0x0;
        sStack_c8 = 0;
        local_e0 = (HistogramLiteral *)0x0;
        sStack_d8 = 0;
        local_f0 = (uint32_t *)0x0;
        sStack_e8 = 0;
        local_100 = (uint32_t *)0x0;
        sStack_f8 = 0;
        local_338 = local_2a8;
        local_330 = (uint16_t *)CONCAT44(local_330._4_4_,(uint)prev_byte);
        BrotliBuildMetaBlock
                  (&memory_manager,puVar38,uVar39,0x7fffffffffffffff,
                   (BrotliEncoderParams *)&available_out,prev_byte,(uint8_t)local_2a8,local_348,
                   (size_t)puVar22,literal_context_mode,(MetaBlockSplit *)&available_in);
        num_distance_codes = local_70;
        if (0x21f < local_70) {
          num_distance_codes = 0x220;
        }
        BrotliOptimizeHistograms(num_distance_codes,(MetaBlockSplit *)&available_in);
        puVar24 = (uint16_t *)BrotliAllocate(&memory_manager,local_340 * 2 + 0x1f7);
        sVar35 = local_340;
        *puVar24 = last_bytes;
        prev_byte_00 = (uint8_t)local_330;
        local_330 = puVar24;
        BrotliStoreMetaBlock
                  (&memory_manager,puVar38,uVar39,local_340,0x7fffffffffffffff,prev_byte_00,
                   (uint8_t)local_338,(int)local_368,(BrotliEncoderParams *)&available_out,
                   literal_context_mode,pCVar16,(size_t)puVar22,(MetaBlockSplit *)&available_in,
                   &local_350,(uint8_t *)puVar24);
        if (sVar35 + 4 < local_350 >> 3) {
          dist_cache[0] = saved_dist_cache[0];
          dist_cache[1] = saved_dist_cache[1];
          dist_cache[2] = saved_dist_cache[2];
          dist_cache[3] = saved_dist_cache[3];
          *local_330 = last_bytes;
          local_350 = (ulong)last_bytes_bits;
          BrotliStoreUncompressedMetaBlock
                    ((int)local_368,local_360,uVar39,0x7fffffffffffffff,sVar35,&local_350,
                     (uint8_t *)local_330);
        }
        BrotliDestroyBlockSplit(&memory_manager,(BlockSplit *)&available_in);
        BrotliDestroyBlockSplit(&memory_manager,&local_160);
        BrotliDestroyBlockSplit(&memory_manager,&local_130);
        BrotliFree(&memory_manager,local_100);
        local_100 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_f0);
        local_f0 = (uint32_t *)0x0;
        BrotliFree(&memory_manager,local_e0);
        local_e0 = (HistogramLiteral *)0x0;
        BrotliFree(&memory_manager,local_d0);
        local_d0 = (HistogramCommand *)0x0;
        BrotliFree(&memory_manager,local_c0);
        uVar25 = local_320;
        puVar22 = local_330;
      }
    }
    uVar27 = local_370;
    uVar39 = local_350 >> 3;
    last_bytes = (uint16_t)*(byte *)((long)puVar22 + uVar39);
    last_bytes_bits = (byte)local_350 & 7;
    if (uVar25 < local_370) {
      local_2a8 = (ulong)local_360[uVar25 - 2];
      prev_byte = local_360[uVar25 - 1];
    }
    saved_dist_cache[0] = dist_cache[0];
    saved_dist_cache[1] = dist_cache[1];
    saved_dist_cache[2] = dist_cache[2];
    saved_dist_cache[3] = dist_cache[3];
    local_2f0 = local_2f0 + uVar39;
    bVar40 = local_2f0 <= uVar31;
    if (bVar40) {
      memcpy(local_2a0,puVar22,uVar39);
      local_2a0 = local_2a0 + uVar39;
    }
    puVar38 = local_360;
    BrotliFree(&memory_manager,puVar22);
    BrotliFree(&memory_manager,local_348);
    uVar39 = uVar25;
  }
  *local_358 = local_2f0;
  BrotliFree(&memory_manager,local_380);
  if ((!bVar40) || ((iVar4 = 1, sVar6 != 0 && (sVar6 < *local_358)))) {
LAB_00104fcb:
    *local_358 = 0;
    iVar4 = 0;
    if (sVar6 - 1 < uVar31) {
      encoded_buffer[0] = '!';
      encoded_buffer[1] = '\x03';
      lVar34 = 2;
      iVar4 = 1;
      lVar32 = 0;
      for (uVar31 = local_370; uVar31 != 0; uVar31 = uVar31 - __n) {
        __n = 0x1000000;
        if (uVar31 < 0x1000000) {
          __n = uVar31;
        }
        iVar3 = 2 - (uint)(uVar31 < 0x100001);
        if (uVar31 < 0x10001) {
          iVar3 = 0;
        }
        uVar19 = ((int)__n * 8 + iVar3 * 2) - 8;
        uVar5 = 0x80000 << ((byte)(iVar3 << 2) & 0x1f) | uVar19;
        encoded_buffer[lVar34] = (uint8_t)uVar19;
        encoded_buffer[lVar34 + 1] = (uint8_t)((uint)((int)__n * 8 + -8) >> 8);
        encoded_buffer[lVar34 + 2] = (uint8_t)(uVar5 >> 0x10);
        if (uVar31 < 0x100001) {
          lVar34 = lVar34 + 3;
        }
        else {
          encoded_buffer[lVar34 + 3] = (uint8_t)(uVar5 >> 0x18);
          lVar34 = lVar34 + 4;
        }
        memcpy(encoded_buffer + lVar34,local_360 + lVar32,__n);
        lVar34 = lVar34 + __n;
        lVar32 = lVar32 + __n;
      }
      encoded_buffer[lVar34] = '\x03';
      *local_358 = lVar34 + 1;
    }
  }
  return iVar4;
code_r0x001047e8:
  lVar32 = lVar32 + -8;
  uVar14 = uVar14 + 1;
  goto LAB_001047cf;
}

Assistant:

BROTLI_BOOL BrotliEncoderCompress(
    int quality, int lgwin, BrotliEncoderMode mode, size_t input_size,
    const uint8_t* input_buffer, size_t* encoded_size,
    uint8_t* encoded_buffer) {
  BrotliEncoderState* s;
  size_t out_size = *encoded_size;
  const uint8_t* input_start = input_buffer;
  uint8_t* output_start = encoded_buffer;
  size_t max_out_size = BrotliEncoderMaxCompressedSize(input_size);
  if (out_size == 0) {
    /* Output buffer needs at least one byte. */
    return BROTLI_FALSE;
  }
  if (input_size == 0) {
    /* Handle the special case of empty input. */
    *encoded_size = 1;
    *encoded_buffer = 6;
    return BROTLI_TRUE;
  }
  if (quality == 10) {
    /* TODO: Implement this direct path for all quality levels. */
    const int lg_win = BROTLI_MIN(int, BROTLI_LARGE_MAX_WINDOW_BITS,
                                       BROTLI_MAX(int, 16, lgwin));
    int ok = BrotliCompressBufferQuality10(lg_win, input_size, input_buffer,
                                           encoded_size, encoded_buffer);
    if (!ok || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }

  s = BrotliEncoderCreateInstance(0, 0, 0);
  if (!s) {
    return BROTLI_FALSE;
  } else {
    size_t available_in = input_size;
    const uint8_t* next_in = input_buffer;
    size_t available_out = *encoded_size;
    uint8_t* next_out = encoded_buffer;
    size_t total_out = 0;
    BROTLI_BOOL result = BROTLI_FALSE;
    BrotliEncoderSetParameter(s, BROTLI_PARAM_QUALITY, (uint32_t)quality);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_LGWIN, (uint32_t)lgwin);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_MODE, (uint32_t)mode);
    BrotliEncoderSetParameter(s, BROTLI_PARAM_SIZE_HINT, (uint32_t)input_size);
    if (lgwin > BROTLI_MAX_WINDOW_BITS) {
      BrotliEncoderSetParameter(s, BROTLI_PARAM_LARGE_WINDOW, BROTLI_TRUE);
    }
    result = BrotliEncoderCompressStream(s, BROTLI_OPERATION_FINISH,
        &available_in, &next_in, &available_out, &next_out, &total_out);
    if (!BrotliEncoderIsFinished(s)) result = 0;
    *encoded_size = total_out;
    BrotliEncoderDestroyInstance(s);
    if (!result || (max_out_size && *encoded_size > max_out_size)) {
      goto fallback;
    }
    return BROTLI_TRUE;
  }
fallback:
  *encoded_size = 0;
  if (!max_out_size) return BROTLI_FALSE;
  if (out_size >= max_out_size) {
    *encoded_size =
        MakeUncompressedStream(input_start, input_size, output_start);
    return BROTLI_TRUE;
  }
  return BROTLI_FALSE;
}